

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  FILE *pFVar2;
  undefined4 local_74;
  seqdiff_results_t *psStack_70;
  int option_index;
  seqdiff_results_t *results;
  int only_summarize;
  int use_header;
  FILE *c_output_fp;
  FILE *b_output_fp;
  FILE *a_output_fp;
  char *c_output_file;
  char *b_output_file;
  char *a_output_file;
  char *second_file;
  char *first_file;
  char **ppcStack_18;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  second_file = (char *)0x0;
  a_output_file = (char *)0x0;
  b_output_file = (char *)0x0;
  c_output_file = (char *)0x0;
  a_output_fp = (FILE *)0x0;
  b_output_fp = (FILE *)0x0;
  c_output_fp = (FILE *)0x0;
  _only_summarize = 0;
  results._4_4_ = 0;
  results._0_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  psStack_70 = seqdiff_results_init();
  verbose_flag = 0;
  progname = *ppcStack_18;
  if ((int)argv_local < 2) {
    show_usage(1);
  }
  while( true ) {
    local_74 = 0;
    first_file._4_4_ =
         getopt_long((int)argv_local,ppcStack_18,"vVh?sd1:2:a:b:c:",main::long_options,&local_74);
    if (first_file._4_4_ == -1) break;
    switch(first_file._4_4_) {
    case 0x31:
      sVar1 = strlen(_optarg);
      second_file = (char *)malloc(sVar1 + 1);
      strcpy(second_file,_optarg);
      break;
    case 0x32:
      sVar1 = strlen(_optarg);
      a_output_file = (char *)malloc(sVar1 + 1);
      strcpy(a_output_file,_optarg);
      break;
    default:
      abort();
    case 0x3f:
      break;
    case 0x56:
      printf("Version is %f\n",0x3fb999999999999a);
      break;
    case 0x61:
      sVar1 = strlen(_optarg);
      b_output_file = (char *)malloc(sVar1 + 1);
      strcpy(b_output_file,_optarg);
      break;
    case 0x62:
      sVar1 = strlen(_optarg);
      c_output_file = (char *)malloc(sVar1 + 1);
      strcpy(c_output_file,_optarg);
      break;
    case 99:
      sVar1 = strlen(_optarg);
      a_output_fp = (FILE *)malloc(sVar1 + 1);
      strcpy((char *)a_output_fp,_optarg);
      break;
    case 100:
      results._4_4_ = 1;
      break;
    case 0x68:
      show_usage(1);
      break;
    case 0x73:
      results._0_4_ = 1;
      break;
    case 0x76:
      verbose_flag = 1;
    }
  }
  if (verbose_flag != 0) {
    fprintf(_stderr,"verbose flag is set\n");
    fprintf(_stderr,"First file is %s\n",second_file);
    fprintf(_stderr,"Second file is %s\n",a_output_file);
    if (((b_output_file == (char *)0x0) || (b_output_file == (char *)0x0)) ||
       (b_output_file == (char *)0x0)) {
      fprintf(_stderr,"No output files will be generated\n");
    }
    else {
      fprintf(_stderr,"Output will be written to files:\n");
      fprintf(_stderr,"  first file uniques: %s\n",b_output_file);
      fprintf(_stderr,"  second file uniques: %s\n",c_output_file);
      fprintf(_stderr,"  common to both input files: %s\n",a_output_fp);
    }
    if (results._4_4_ == 0) {
      fprintf(_stderr,"Processing will be done using sequences\n");
    }
    else {
      fprintf(_stderr,"Processing will be done using headers, not sequences\n");
    }
    if ((int)results != 0) {
      fprintf(_stderr,"Only showing summary information\n");
    }
  }
  if (second_file == (char *)0x0) {
    fprintf(_stderr,"Error: First sequence file is required.\n");
    argv_local._4_4_ = 1;
  }
  else if (a_output_file == (char *)0x0) {
    fprintf(_stderr,"Error: First sequence file is required.\n");
    argv_local._4_4_ = 1;
  }
  else {
    psStack_70->first_file = second_file;
    psStack_70->second_file = a_output_file;
    psStack_70->use_header = results._4_4_;
    psStack_70->only_summarize = (int)results;
    if (((b_output_file != (char *)0x0) && (c_output_file != (char *)0x0)) &&
       (a_output_fp != (FILE *)0x0)) {
      pFVar2 = fopen(b_output_file,"w+");
      psStack_70->a_output_fp = (FILE *)pFVar2;
      if (psStack_70->a_output_fp == (FILE *)0x0) {
        fprintf(_stderr,"%s - failed to open file %s\n",progname,b_output_file);
        exit(1);
      }
      pFVar2 = fopen(c_output_file,"w+");
      psStack_70->b_output_fp = (FILE *)pFVar2;
      if (psStack_70->b_output_fp == (FILE *)0x0) {
        fprintf(_stderr,"%s - failed to open file %s\n",progname,c_output_file);
        exit(1);
      }
      pFVar2 = fopen((char *)a_output_fp,"w+");
      psStack_70->c_output_fp = (FILE *)pFVar2;
      if (psStack_70->c_output_fp == (FILE *)0x0) {
        fprintf(_stderr,"%s - failed to open file %s\n",progname,a_output_fp);
        exit(1);
      }
    }
    cmpseq(psStack_70);
    if (((b_output_file != (char *)0x0) && (c_output_file != (char *)0x0)) &&
       (a_output_fp != (FILE *)0x0)) {
      fclose((FILE *)psStack_70->a_output_fp);
      fclose((FILE *)psStack_70->b_output_fp);
      fclose((FILE *)psStack_70->c_output_fp);
    }
    fprintf(_stderr," first_file_total = %d\n",(ulong)(uint)psStack_70->first_file_total);
    fprintf(_stderr,"  first_file_uniq = %d\n",(ulong)(uint)psStack_70->first_file_uniq);
    fprintf(_stderr,"second_file_total = %d\n",(ulong)(uint)psStack_70->second_file_total);
    fprintf(_stderr," second_file_uniq = %d\n",(ulong)(uint)psStack_70->second_file_uniq);
    fprintf(_stderr,"           common = %d\n",(ulong)(uint)psStack_70->common);
    free(second_file);
    free(a_output_file);
    if (b_output_file != (char *)0x0) {
      free(b_output_file);
    }
    if (c_output_file != (char *)0x0) {
      free(c_output_file);
    }
    if (a_output_fp != (FILE *)0x0) {
      free(a_output_fp);
    }
    seqdiff_results_destroy(psStack_70);
    fclose(_stderr);
    fclose(_stdout);
    fclose(_stdin);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;                          /* character for getopt processing */
	/* command argument variables */
	char *first_file = NULL;
	char *second_file = NULL;
	char *a_output_file = NULL;
	char *b_output_file = NULL;
	char *c_output_file = NULL;
	FILE *a_output_fp = NULL;
	FILE *b_output_fp = NULL;
	FILE *c_output_fp = NULL;
	int use_header = 0;
	int only_summarize = 0;

	/* internal variables */
	seqdiff_results_t *results;
	results = seqdiff_results_init();

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */
	progname = argv[0]; /* capture the program name */
	if (argc < 2) {
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",    no_argument, 0, 'v'},
			{"version",    no_argument, 0, 'V'},
			{"help",       no_argument, 0, 'h'},
			{"summary",    no_argument, 0, 's'},
			{"headers",    no_argument, 0, 'd'},
			{"first",      required_argument, 0, '1'},
			{"second",     required_argument, 0, '2'},
			{"a_output",   required_argument, 0, 'a'},
			{"b_output",   required_argument, 0, 'b'},
			{"c_output",   required_argument, 0, 'c'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long(argc, argv, "vVh?sd1:2:a:b:c:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'V':
				/* version */
				printf("Version is %f\n",VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			case 's':
				only_summarize = 1;
				break;

			case 'd':
				use_header = 1;
				break;

			case '1':
				first_file = (char*) malloc(strlen(optarg)+1);
				strcpy(first_file,optarg);
				break;

			case '2':
				second_file = (char*) malloc(strlen(optarg)+1);
				strcpy(second_file,optarg);
				break;

			case 'a':
				a_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(a_output_file,optarg);
				break;

			case 'b':
				b_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(b_output_file,optarg);
				break;

			case 'c':
				c_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(c_output_file,optarg);
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"First file is %s\n", first_file);
		fprintf(stderr,"Second file is %s\n", second_file);
		if (a_output_file != NULL && a_output_file != NULL && a_output_file != NULL) {
			fprintf(stderr, "Output will be written to files:\n");
			fprintf(stderr, "  first file uniques: %s\n", a_output_file);
			fprintf(stderr, "  second file uniques: %s\n", b_output_file);
			fprintf(stderr, "  common to both input files: %s\n", c_output_file);
		} else
			fprintf(stderr,"No output files will be generated\n");

		if (use_header)
			fprintf(stderr,"Processing will be done using headers, not sequences\n");
		else
			fprintf(stderr,"Processing will be done using sequences\n");
		if (only_summarize)
			fprintf(stderr,"Only showing summary information\n");
	}

	/* check validity of given argument combination */
	if (! first_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	if (! second_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	results->first_file = first_file;
	results->second_file = second_file;
	results->use_header = use_header;
	results->only_summarize = only_summarize;
	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		results->a_output_fp = fopen(a_output_file,"w+");
		if (!results->a_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,a_output_file);
			exit(EXIT_FAILURE);
		}
		results->b_output_fp = fopen(b_output_file,"w+");
		if (!results->b_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,b_output_file);
			exit(EXIT_FAILURE);
		}
		results->c_output_fp = fopen(c_output_file,"w+");
		if (!results->c_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,c_output_file);
			exit(EXIT_FAILURE);
		}
	}

	/* do the comparison */
	cmpseq(results);

	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		fclose(results->a_output_fp);
		fclose(results->b_output_fp);
		fclose(results->c_output_fp);
	}

	/* report results */
	fprintf(stderr, " first_file_total = %d\n", results->first_file_total);
	fprintf(stderr, "  first_file_uniq = %d\n", results->first_file_uniq);
	fprintf(stderr, "second_file_total = %d\n", results->second_file_total);
	fprintf(stderr, " second_file_uniq = %d\n", results->second_file_uniq);
	fprintf(stderr, "           common = %d\n",           results->common);

	free(first_file);
	free(second_file);
	if (a_output_file != NULL)
		free(a_output_file);
	if (b_output_file != NULL)
		free(b_output_file);
	if (c_output_file != NULL)
		free(c_output_file);

	/* clean up */
	seqdiff_results_destroy(results);
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}